

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O2

char * skynet_command(skynet_context *context,char *cmd,char *param)

{
  int iVar1;
  char *pcVar2;
  _func_char_ptr_skynet_context_ptr_char_ptr **pp_Var3;
  
  pp_Var3 = &cmd_funcs[0].func;
  while( true ) {
    if (((command_func *)(pp_Var3 + -1))->name == (char *)0x0) {
      return (char *)0x0;
    }
    iVar1 = strcmp(cmd,((command_func *)(pp_Var3 + -1))->name);
    if (iVar1 == 0) break;
    pp_Var3 = pp_Var3 + 2;
  }
  pcVar2 = (**pp_Var3)(context,param);
  return pcVar2;
}

Assistant:

const char * 
skynet_command(struct skynet_context * context, const char * cmd , const char * param) {
	struct command_func * method = &cmd_funcs[0];
	while(method->name) {
		if (strcmp(cmd, method->name) == 0) {
			return method->func(context, param);
		}
		++method;
	}

	return NULL;
}